

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util_test.cc
# Opt level: O0

void __thiscall
StringPieceUtilTestEqualsCaseInsensitiveASCII::Run
          (StringPieceUtilTestEqualsCaseInsensitiveASCII *this)

{
  Test *pTVar1;
  bool bVar2;
  StringPiece local_110;
  StringPiece local_100;
  StringPiece local_f0;
  StringPiece local_e0;
  StringPiece local_d0;
  StringPiece local_c0;
  StringPiece local_b0;
  StringPiece local_a0;
  StringPiece local_90;
  StringPiece local_80;
  StringPiece local_70;
  StringPiece local_60;
  StringPiece local_50;
  StringPiece local_40;
  StringPiece local_30;
  StringPiece local_20;
  StringPieceUtilTestEqualsCaseInsensitiveASCII *local_10;
  StringPieceUtilTestEqualsCaseInsensitiveASCII *this_local;
  
  pTVar1 = g_current_test;
  local_10 = this;
  StringPiece::StringPiece(&local_20,"abc");
  StringPiece::StringPiece(&local_30,"abc");
  bVar2 = EqualsCaseInsensitiveASCII(local_20,local_30);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x7a,"EqualsCaseInsensitiveASCII(\"abc\", \"abc\")");
  pTVar1 = g_current_test;
  StringPiece::StringPiece(&local_40,"abc");
  StringPiece::StringPiece(&local_50,"ABC");
  bVar2 = EqualsCaseInsensitiveASCII(local_40,local_50);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x7b,"EqualsCaseInsensitiveASCII(\"abc\", \"ABC\")");
  pTVar1 = g_current_test;
  StringPiece::StringPiece(&local_60,"abc");
  StringPiece::StringPiece(&local_70,"aBc");
  bVar2 = EqualsCaseInsensitiveASCII(local_60,local_70);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x7c,"EqualsCaseInsensitiveASCII(\"abc\", \"aBc\")");
  pTVar1 = g_current_test;
  StringPiece::StringPiece(&local_80,"AbC");
  StringPiece::StringPiece(&local_90,"aBc");
  bVar2 = EqualsCaseInsensitiveASCII(local_80,local_90);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x7d,"EqualsCaseInsensitiveASCII(\"AbC\", \"aBc\")");
  pTVar1 = g_current_test;
  StringPiece::StringPiece(&local_a0,"");
  StringPiece::StringPiece(&local_b0,"");
  bVar2 = EqualsCaseInsensitiveASCII(local_a0,local_b0);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x7e,"EqualsCaseInsensitiveASCII(\"\", \"\")");
  pTVar1 = g_current_test;
  StringPiece::StringPiece(&local_c0,"a");
  StringPiece::StringPiece(&local_d0,"ac");
  bVar2 = EqualsCaseInsensitiveASCII(local_c0,local_d0);
  testing::Test::Check
            (pTVar1,(bool)((bVar2 ^ 0xffU) & 1),
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x80,"EqualsCaseInsensitiveASCII(\"a\", \"ac\")");
  pTVar1 = g_current_test;
  StringPiece::StringPiece(&local_e0,"/");
  StringPiece::StringPiece(&local_f0,"\\");
  bVar2 = EqualsCaseInsensitiveASCII(local_e0,local_f0);
  testing::Test::Check
            (pTVar1,(bool)((bVar2 ^ 0xffU) & 1),
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x81,"EqualsCaseInsensitiveASCII(\"/\", \"\\\\\")");
  pTVar1 = g_current_test;
  StringPiece::StringPiece(&local_100,"1");
  StringPiece::StringPiece(&local_110,"10");
  bVar2 = EqualsCaseInsensitiveASCII(local_100,local_110);
  testing::Test::Check
            (pTVar1,(bool)((bVar2 ^ 0xffU) & 1),
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x82,"EqualsCaseInsensitiveASCII(\"1\", \"10\")");
  return;
}

Assistant:

TEST(StringPieceUtilTest, EqualsCaseInsensitiveASCII) {
  EXPECT_TRUE(EqualsCaseInsensitiveASCII("abc", "abc"));
  EXPECT_TRUE(EqualsCaseInsensitiveASCII("abc", "ABC"));
  EXPECT_TRUE(EqualsCaseInsensitiveASCII("abc", "aBc"));
  EXPECT_TRUE(EqualsCaseInsensitiveASCII("AbC", "aBc"));
  EXPECT_TRUE(EqualsCaseInsensitiveASCII("", ""));

  EXPECT_FALSE(EqualsCaseInsensitiveASCII("a", "ac"));
  EXPECT_FALSE(EqualsCaseInsensitiveASCII("/", "\\"));
  EXPECT_FALSE(EqualsCaseInsensitiveASCII("1", "10"));
}